

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64 uVar1;
  undefined8 uVar2;
  bool bVar3;
  WeightParamType WVar4;
  BatchnormLayerParams *pBVar5;
  WeightParams *param;
  WeightParams *pWVar6;
  WeightParams *param_00;
  WeightParams *param_01;
  string *psVar7;
  WeightParams *weight;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  bool local_515;
  bool local_4b5;
  bool local_455;
  allocator local_3b1;
  string local_3b0;
  allocator local_389;
  string local_388;
  Result local_368;
  allocator local_339;
  string local_338;
  allocator local_311;
  string local_310;
  Result local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  string err_1;
  string local_280;
  allocator local_259;
  string local_258;
  Result local_238;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  Result local_1c0;
  uint64 local_198;
  uint64_t num_channels;
  undefined1 local_170 [8];
  string err;
  undefined1 local_148 [4];
  bool invalid_params;
  bool has_f16_params;
  bool has_f32_params;
  Result local_128;
  allocator local_f9;
  string local_f8;
  Result local_d8;
  undefined4 local_ac;
  Result local_a8;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar3 = Result::good((Result *)local_48);
  if (bVar3) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
  }
  bVar3 = Result::good((Result *)local_48);
  uVar2 = r.m_message.field_2._8_8_;
  if (!bVar3) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a1f284;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"Batchnorm",&local_f9);
    validateInputOutputRankEquality
              (&local_d8,(NeuralNetworkLayer *)uVar2,&local_f8,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_d8);
    Result::~Result(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    bVar3 = Result::good((Result *)local_48);
    uVar2 = r.m_message.field_2._8_8_;
    if (!bVar3) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a1f284;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_148,"Batchnorm",(allocator *)(err.field_2._M_local_buf + 0xf));
    validateRankCount(&local_128,(NeuralNetworkLayer *)uVar2,(string *)local_148,3,-1,
                      &this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_128);
    Result::~Result(&local_128);
    std::__cxx11::string::~string((string *)local_148);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    bVar3 = Result::good((Result *)local_48);
    if (!bVar3) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a1f284;
    }
  }
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  Specification::BatchnormLayerParams::gamma(pBVar5,extraout_XMM0_Qa);
  WVar4 = valueType(param);
  local_455 = true;
  if (WVar4 != FLOAT32) {
    pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    pWVar6 = Specification::BatchnormLayerParams::beta(pBVar5);
    WVar4 = valueType(pWVar6);
    local_455 = true;
    if (WVar4 != FLOAT32) {
      pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
      WVar4 = valueType(pWVar6);
      local_455 = true;
      if (WVar4 != FLOAT32) {
        pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        pWVar6 = Specification::BatchnormLayerParams::variance(pBVar5);
        WVar4 = valueType(pWVar6);
        local_455 = WVar4 == FLOAT32;
      }
    }
  }
  err.field_2._M_local_buf[0xe] = local_455;
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  Specification::BatchnormLayerParams::gamma(pBVar5,extraout_XMM0_Qa_00);
  WVar4 = valueType(param_00);
  local_4b5 = true;
  if (WVar4 != FLOAT16) {
    pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    pWVar6 = Specification::BatchnormLayerParams::beta(pBVar5);
    WVar4 = valueType(pWVar6);
    local_4b5 = true;
    if (WVar4 != FLOAT16) {
      pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
      WVar4 = valueType(pWVar6);
      local_4b5 = true;
      if (WVar4 != FLOAT16) {
        pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        pWVar6 = Specification::BatchnormLayerParams::variance(pBVar5);
        WVar4 = valueType(pWVar6);
        local_4b5 = WVar4 == FLOAT16;
      }
    }
  }
  err.field_2._M_local_buf[0xd] = local_4b5;
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  Specification::BatchnormLayerParams::gamma(pBVar5,extraout_XMM0_Qa_01);
  WVar4 = valueType(param_01);
  local_515 = true;
  if (WVar4 != UNSPECIFIED) {
    pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    pWVar6 = Specification::BatchnormLayerParams::beta(pBVar5);
    WVar4 = valueType(pWVar6);
    local_515 = true;
    if (WVar4 != UNSPECIFIED) {
      pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
      WVar4 = valueType(pWVar6);
      local_515 = true;
      if (WVar4 != UNSPECIFIED) {
        pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        pWVar6 = Specification::BatchnormLayerParams::variance(pBVar5);
        WVar4 = valueType(pWVar6);
        local_515 = WVar4 == UNSPECIFIED;
      }
    }
  }
  err.field_2._M_local_buf[0xc] = local_515;
  if ((((err.field_2._M_local_buf[0xe] & 1U) != 0) && ((err.field_2._M_local_buf[0xd] & 1U) != 0))
     || (local_515 != false)) {
    psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &num_channels,"Batchnorm layer \'",psVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &num_channels,
                   "\' parameters have values for both full and half precision. Parameters should either be specified in half or full precision, mixed parameters are not supported."
                  );
    std::__cxx11::string::~string((string *)&num_channels);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_170);
    local_ac = 1;
    std::__cxx11::string::~string((string *)local_170);
    goto LAB_00a1f284;
  }
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  local_198 = Specification::BatchnormLayerParams::channels(pBVar5);
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  Specification::BatchnormLayerParams::gamma(pBVar5,extraout_XMM0_Qa_02);
  uVar1 = local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"BatchNorm",&local_1e1);
  psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"gamma",&local_209);
  validateGeneralWeightParams(&local_1c0,weight,uVar1,1,&local_1e0,psVar7,&local_208);
  Result::operator=((Result *)local_48,&local_1c0);
  Result::~Result(&local_1c0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  bVar3 = Result::good((Result *)local_48);
  if (!bVar3) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a1f284;
  }
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  pWVar6 = Specification::BatchnormLayerParams::beta(pBVar5);
  uVar1 = local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"BatchNorm",&local_259);
  psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_280,"beta",(allocator *)(err_1.field_2._M_local_buf + 0xf));
  validateGeneralWeightParams(&local_238,pWVar6,uVar1,1,&local_258,psVar7,&local_280);
  Result::operator=((Result *)local_48,&local_238);
  Result::~Result(&local_238);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)(err_1.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  bVar3 = Result::good((Result *)local_48);
  if (!bVar3) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a1f284;
  }
  pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  bVar3 = Specification::BatchnormLayerParams::computemeanvar(pBVar5);
  if (bVar3) {
LAB_00a1f26a:
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
  }
  else {
    pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
    WVar4 = valueType(pWVar6);
    if (WVar4 != EMPTY) {
      pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
      WVar4 = valueType(pWVar6);
      if (WVar4 != EMPTY) {
        pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        pWVar6 = Specification::BatchnormLayerParams::mean(pBVar5);
        uVar1 = local_198;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_310,"BatchNorm",&local_311);
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_338,"mean",&local_339);
        validateGeneralWeightParams(&local_2f0,pWVar6,uVar1,1,&local_310,psVar7,&local_338);
        Result::operator=((Result *)local_48,&local_2f0);
        Result::~Result(&local_2f0);
        std::__cxx11::string::~string((string *)&local_338);
        std::allocator<char>::~allocator((allocator<char> *)&local_339);
        std::__cxx11::string::~string((string *)&local_310);
        std::allocator<char>::~allocator((allocator<char> *)&local_311);
        bVar3 = Result::good((Result *)local_48);
        if (!bVar3) {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
          local_ac = 1;
          goto LAB_00a1f284;
        }
        pBVar5 = Specification::NeuralNetworkLayer::batchnorm
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        pWVar6 = Specification::BatchnormLayerParams::variance(pBVar5);
        uVar1 = local_198;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_388,"BatchNorm",&local_389);
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3b0,"variance",&local_3b1);
        validateGeneralWeightParams(&local_368,pWVar6,uVar1,1,&local_388,psVar7,&local_3b0);
        Result::operator=((Result *)local_48,&local_368);
        Result::~Result(&local_368);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
        bVar3 = Result::good((Result *)local_48);
        if (!bVar3) {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
          local_ac = 1;
          goto LAB_00a1f284;
        }
        goto LAB_00a1f26a;
      }
    }
    psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+(&local_2c8,"Batchnorm layer \'",psVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                   &local_2c8,"\' is missing mean and variance.");
    std::__cxx11::string::~string((string *)&local_2c8);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_2a8);
    local_ac = 1;
    std::__cxx11::string::~string((string *)local_2a8);
  }
LAB_00a1f284:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    r = validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta");
    if (!r.good()) return r;
    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        r = validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance");
        if (!r.good()) return r;
    }
    return r;
}